

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::DebugString
          (FieldDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options
          )

{
  bool bVar1;
  Edition EVar2;
  int value;
  FieldOptions_CType value_00;
  FieldDescriptor *pFVar3;
  OneofDescriptor *pOVar4;
  FileDescriptor *pFVar5;
  FieldOptions *from;
  DescriptorPool *options;
  Descriptor *pDVar6;
  AlphaNum *b;
  Arg *a0;
  string_view src;
  string_view sVar7;
  Arg *in_stack_fffffffffffff9f8;
  undefined1 local_4c8 [8];
  string formatted_options;
  FieldOptions full_options;
  string local_400;
  string local_3e0;
  Arg local_3c0;
  string_view local_390;
  byte local_379;
  undefined1 local_378 [7];
  bool bracketed;
  string_view local_348;
  Arg local_338;
  Arg local_308;
  Arg local_2d8;
  Arg local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  undefined1 local_268 [8];
  SourceLocationCommentPrinter comment_printer;
  AlphaNum local_1a0;
  undefined1 local_170 [8];
  string label;
  string local_130;
  Arg local_110;
  string local_e0;
  Arg local_c0;
  string_view local_90;
  undefined1 local_80 [8];
  string field_type;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string prefix;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  FieldDescriptor *this_local;
  
  prefix.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::string::string((string *)local_80);
  bVar1 = is_map(this);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_90,"map<$0, $1>");
    pDVar6 = message_type(this);
    pFVar3 = Descriptor::field(pDVar6,0);
    FieldTypeNameDebugString_abi_cxx11_(&local_e0,pFVar3);
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_c0,&local_e0);
    pDVar6 = message_type(this);
    pFVar3 = Descriptor::field(pDVar6,1);
    FieldTypeNameDebugString_abi_cxx11_(&local_130,pFVar3);
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_110,&local_130);
    absl::lts_20250127::SubstituteAndAppend
              ((Nonnull<std::string_*>)local_80,local_90,&local_c0,&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    FieldTypeNameDebugString_abi_cxx11_((string *)((long)&label.field_2 + 8),this);
    std::__cxx11::string::operator=((string *)local_80,(string *)(label.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(label.field_2._M_local_buf + 8));
  }
  b = (AlphaNum *)(ulong)((byte)this->field_0x1 >> 6);
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_1a0,*(Nullable<const_char_*> *)(kLabelToName + (long)b * 8));
  absl::lts_20250127::AlphaNum::AlphaNum
            ((AlphaNum *)((long)&comment_printer.prefix_.field_2 + 8)," ");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_170,(lts_20250127 *)&local_1a0,
             (AlphaNum *)((long)&comment_printer.prefix_.field_2 + 8),b);
  bVar1 = is_map(this);
  if (((bVar1) || (pOVar4 = real_containing_oneof(this), pOVar4 != (OneofDescriptor *)0x0)) ||
     ((bVar1 = is_required(this), !bVar1 &&
      ((bVar1 = is_repeated(this), !bVar1 && (bVar1 = has_optional_keyword(this), !bVar1)))))) {
    std::__cxx11::string::clear();
  }
  bVar1 = is_repeated(this);
  if (!bVar1) {
    pFVar5 = file(this);
    EVar2 = FileDescriptor::edition(pFVar5);
    bVar1 = anon_unknown_24::IsLegacyEdition(EVar2);
    if (!bVar1) {
      std::__cxx11::string::clear();
    }
  }
  anon_unknown_24::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::FieldDescriptor>
            ((SourceLocationCommentPrinter *)local_268,this,(string *)local_48,
             (DebugStringOptions *)prefix.field_2._8_8_);
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_268,contents);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_278,"$0$1$2 $3 = $4");
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_2a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_2d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_308,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  pFVar5 = file(this);
  EVar2 = FileDescriptor::edition(pFVar5);
  bVar1 = anon_unknown_24::IsGroupSyntax(EVar2,this);
  if (bVar1) {
    pDVar6 = message_type(this);
    local_348 = Descriptor::name(pDVar6);
  }
  else {
    local_348 = name(this);
  }
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_338,local_348);
  value = number(this);
  absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)local_378,value);
  a0 = &local_2d8;
  sVar7._M_str = (char *)&local_2a8;
  sVar7._M_len = (size_t)local_278._M_str;
  absl::lts_20250127::SubstituteAndAppend
            ((lts_20250127 *)contents,(Nonnull<std::string_*>)local_278._M_len,sVar7,a0,&local_308,
             &local_338,(Arg *)local_378,in_stack_fffffffffffff9f8);
  local_379 = 0;
  bVar1 = has_default_value(this);
  if (bVar1) {
    local_379 = 1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_390," [default = $0");
    DefaultValueAsString_abi_cxx11_(&local_3e0,this,true);
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_3c0,&local_3e0);
    absl::lts_20250127::SubstituteAndAppend(contents,local_390,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  if (((byte)this->field_0x1 >> 2 & 1) != 0) {
    if ((local_379 & 1) == 0) {
      local_379 = 1;
      std::__cxx11::string::append((char *)contents);
    }
    else {
      std::__cxx11::string::append((char *)contents);
    }
    std::__cxx11::string::append((char *)contents);
    sVar7 = json_name(this);
    src._M_len = sVar7._M_str;
    src._M_str = (char *)sVar7._M_len;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_400,(lts_20250127 *)sVar7._M_len,src);
    std::__cxx11::string::append((string *)contents);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::append((char *)contents);
  }
  from = FieldDescriptor::options(this);
  FieldOptions::FieldOptions((FieldOptions *)((long)&formatted_options.field_2 + 8),from);
  anon_unknown_24::CopyFeaturesToOptions<google::protobuf::FieldOptions>
            (this->proto_features_,(FieldOptions *)((long)&formatted_options.field_2 + 8));
  bVar1 = has_legacy_proto_ctype(this);
  if (bVar1) {
    value_00 = legacy_proto_ctype(this);
    FieldOptions::set_ctype((FieldOptions *)((long)&formatted_options.field_2 + 8),value_00);
  }
  std::__cxx11::string::string((string *)local_4c8);
  pFVar5 = file(this);
  options = FileDescriptor::pool(pFVar5);
  bVar1 = anon_unknown_24::FormatBracketedOptions
                    ((anon_unknown_24 *)(ulong)(uint)depth,(int)&formatted_options + 0x18,
                     (Message *)options,(DescriptorPool *)local_4c8,(string *)a0);
  if (bVar1) {
    std::__cxx11::string::append((char *)contents);
    local_379 = 1;
    std::__cxx11::string::append((string *)contents);
  }
  if ((local_379 & 1) != 0) {
    std::__cxx11::string::append((char *)contents);
  }
  pFVar5 = file(this);
  EVar2 = FileDescriptor::edition(pFVar5);
  bVar1 = anon_unknown_24::IsGroupSyntax(EVar2,this);
  if (bVar1) {
    if ((*(byte *)(prefix.field_2._8_8_ + 1) & 1) == 0) {
      pDVar6 = message_type(this);
      Descriptor::DebugString
                (pDVar6,depth,contents,(DebugStringOptions *)prefix.field_2._8_8_,false);
    }
    else {
      std::__cxx11::string::append((char *)contents);
    }
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_268,contents);
  std::__cxx11::string::~string((string *)local_4c8);
  FieldOptions::~FieldOptions((FieldOptions *)((long)&formatted_options.field_2 + 8));
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_268);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void FieldDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  std::string field_type;

  // Special case map fields.
  if (is_map()) {
    absl::SubstituteAndAppend(
        &field_type, "map<$0, $1>",
        message_type()->field(0)->FieldTypeNameDebugString(),
        message_type()->field(1)->FieldTypeNameDebugString());
  } else {
    field_type = FieldTypeNameDebugString();
  }

  std::string label =
      absl::StrCat(kLabelToName[static_cast<Label>(label_)], " ");

  // Label is omitted for maps, oneof, and plain proto3 fields.
  if (is_map() || real_containing_oneof() ||
      (!is_required() && !is_repeated() && !has_optional_keyword())) {
    label.clear();
  }
  // Label is omitted for optional and required fields under editions.
  if (!is_repeated() && !IsLegacyEdition(file()->edition())) {
    label.clear();
  }

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(
      contents, "$0$1$2 $3 = $4", prefix, label, field_type,
      IsGroupSyntax(file()->edition(), this) ? message_type()->name() : name(),
      number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    absl::SubstituteAndAppend(contents, " [default = $0",
                              DefaultValueAsString(true));
  }
  if (has_json_name_) {
    if (!bracketed) {
      bracketed = true;
      contents->append(" [");
    } else {
      contents->append(", ");
    }
    contents->append("json_name = \"");
    contents->append(absl::CEscape(json_name()));
    contents->append("\"");
  }

  FieldOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  if (has_legacy_proto_ctype()) {
    full_options.set_ctype(
        static_cast<FieldOptions::CType>(legacy_proto_ctype()));
  }
  std::string formatted_options;
  if (FormatBracketedOptions(depth, full_options, file()->pool(),
                             &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (IsGroupSyntax(file()->edition(), this)) {
    if (debug_string_options.elide_group_body) {
      contents->append(" { ... };\n");
    } else {
      message_type()->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ false);
    }
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}